

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O1

void lysp_refine_free(lysf_ctx *ctx,lysp_refine *ref)

{
  lysp_qname *plVar1;
  lysp_restr *plVar2;
  ulong uVar3;
  lysp_ext_instance *plVar4;
  lysp_ext_instance *plVar5;
  uint64_t c__;
  ulong uVar6;
  lysp_ext_instance *plVar7;
  long lVar8;
  
  lydict_remove(ctx->ctx,ref->nodeid);
  lydict_remove(ctx->ctx,ref->dsc);
  lydict_remove(ctx->ctx,ref->ref);
  lVar8 = 0;
  uVar6 = 0;
  while( true ) {
    plVar1 = ref->iffeatures;
    if (plVar1 == (lysp_qname *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ulong *)&plVar1[-1].flags;
    }
    if (uVar3 <= uVar6) break;
    if (plVar1 != (lysp_qname *)0x0) {
      lydict_remove(ctx->ctx,*(char **)((long)&plVar1->str + lVar8));
    }
    uVar6 = uVar6 + 1;
    lVar8 = lVar8 + 0x18;
  }
  if (plVar1 != (lysp_qname *)0x0) {
    free(&plVar1[-1].flags);
  }
  lVar8 = 0;
  plVar7 = (lysp_ext_instance *)0x0;
  while( true ) {
    plVar2 = ref->musts;
    if (plVar2 == (lysp_restr *)0x0) {
      plVar4 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar4 = plVar2[-1].exts;
    }
    if (plVar4 <= plVar7) break;
    lysp_restr_free(ctx,(lysp_restr *)((long)&(plVar2->arg).str + lVar8));
    plVar7 = (lysp_ext_instance *)((long)&plVar7->name + 1);
    lVar8 = lVar8 + 0x40;
  }
  if (plVar2 != (lysp_restr *)0x0) {
    free(&plVar2[-1].exts);
  }
  lydict_remove(ctx->ctx,ref->presence);
  lVar8 = 0;
  uVar6 = 0;
  while( true ) {
    plVar1 = ref->dflts;
    if (plVar1 == (lysp_qname *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ulong *)&plVar1[-1].flags;
    }
    if (uVar3 <= uVar6) break;
    if (plVar1 != (lysp_qname *)0x0) {
      lydict_remove(ctx->ctx,*(char **)((long)&plVar1->str + lVar8));
    }
    uVar6 = uVar6 + 1;
    lVar8 = lVar8 + 0x18;
  }
  if (plVar1 != (lysp_qname *)0x0) {
    free(&plVar1[-1].flags);
  }
  lVar8 = 0;
  plVar7 = (lysp_ext_instance *)0x0;
  while( true ) {
    plVar4 = ref->exts;
    if (plVar4 == (lysp_ext_instance *)0x0) {
      plVar5 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar5 = plVar4[-1].exts;
    }
    if (plVar5 <= plVar7) break;
    lysp_ext_instance_free(ctx,(lysp_ext_instance *)((long)&plVar4->name + lVar8));
    plVar7 = (lysp_ext_instance *)((long)&plVar7->name + 1);
    lVar8 = lVar8 + 0x70;
  }
  if (plVar4 != (lysp_ext_instance *)0x0) {
    free(&plVar4[-1].exts);
    return;
  }
  return;
}

Assistant:

static void
lysp_refine_free(struct lysf_ctx *ctx, struct lysp_refine *ref)
{
    lydict_remove(ctx->ctx, ref->nodeid);
    lydict_remove(ctx->ctx, ref->dsc);
    lydict_remove(ctx->ctx, ref->ref);
    FREE_ARRAY(ctx->ctx, ref->iffeatures, lysp_qname_free);
    FREE_ARRAY(ctx, ref->musts, lysp_restr_free);
    lydict_remove(ctx->ctx, ref->presence);
    FREE_ARRAY(ctx->ctx, ref->dflts, lysp_qname_free);
    FREE_ARRAY(ctx, ref->exts, lysp_ext_instance_free);
}